

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

bool rsg::(anonymous_namespace)::isConversionOk<float,bool>(ConstValueRangeAccess valueRange)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 1.0;
  fVar2 = 1.0;
  if ((valueRange.m_min)->boolVal == false) {
    fVar2 = 0.0;
  }
  if ((valueRange.m_max)->boolVal == false) {
    fVar1 = 0.0;
  }
  return (bool)((~(valueRange.m_min)->boolVal | (valueRange.m_max)->boolVal) & fVar2 <= fVar1);
}

Assistant:

ConstValueAccess			getMax					(void) const	{ return ConstValueAccess(*m_type, m_max);	}